

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texel_fetch_invalid_p
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType DVar1;
  DataType DVar2;
  bool bVar3;
  bool bVar4;
  ContextType ctxType;
  char *__s;
  long *plVar5;
  size_type *psVar6;
  long lVar7;
  DataType dataType;
  string shaderSource;
  DataType in_stack_fffffffffffffbe8;
  string local_410;
  DataType local_3ec;
  long local_3e8;
  allocator<char> local_3d9;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  long local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
  bVar4 = true;
  if (!bVar3) {
    NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)0x2d,dataType);
    bVar4 = NegativeTestContext::isExtensionSupported(ctx,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar4 != false) {
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_410,"texelFetch: Invalid P type.","");
    NegativeTestContext::beginSection(ctx,&local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    lVar7 = 0;
    do {
      shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar7];
      bVar4 = NegativeTestContext::isShaderSupported(ctx,shaderType);
      if (bVar4) {
        local_d8 = lVar7;
        __s = glu::getShaderTypeName(shaderType);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_70,__s,&local_3d9);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1cc56f3);
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_410.field_2._M_allocated_capacity = *psVar6;
          local_410.field_2._8_8_ = plVar5[3];
        }
        else {
          local_410.field_2._M_allocated_capacity = *psVar6;
          local_410._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_410._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        NegativeTestContext::beginSection(ctx,&local_410);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        lVar7 = 0;
        do {
          local_3ec = *(DataType *)
                       ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes +
                       lVar7);
          local_3e8 = lVar7;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x42,local_3ec,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x43,local_3ec,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x44,local_3ec,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          if (local_3e8 != 4) {
            DVar1 = *(DataType *)
                     ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes +
                     local_3e8);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      (&local_410,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x42,DVar1,TYPE_INT,
                       in_stack_fffffffffffffbe8);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_138,local_410._M_dataplus._M_p,
                       local_410._M_dataplus._M_p + local_410._M_string_length);
            verifyShader(ctx,shaderType,&local_138);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_410._M_dataplus._M_p != &local_410.field_2) {
              operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1
                             );
            }
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      (&local_410,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x43,DVar1,TYPE_INT,
                       in_stack_fffffffffffffbe8);
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_158,local_410._M_dataplus._M_p,
                       local_410._M_dataplus._M_p + local_410._M_string_length);
            verifyShader(ctx,shaderType,&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_410._M_dataplus._M_p != &local_410.field_2) {
              operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1
                             );
            }
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      (&local_410,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x44,DVar1,TYPE_INT,
                       in_stack_fffffffffffffbe8);
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_178,local_410._M_dataplus._M_p,
                       local_410._M_dataplus._M_p + local_410._M_string_length);
            verifyShader(ctx,shaderType,&local_178);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_410._M_dataplus._M_p != &local_410.field_2) {
              operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1
                             );
            }
          }
          DVar1 = *(DataType *)
                   ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes +
                   local_3e8);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x42,DVar1,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_198,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x43,DVar1,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_1b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x44,DVar1,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d8,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x55,local_3ec,TYPE_LAST,
                     in_stack_fffffffffffffbe8);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f8,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x56,local_3ec,TYPE_LAST,
                     in_stack_fffffffffffffbe8);
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_218,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x57,local_3ec,TYPE_LAST,
                     in_stack_fffffffffffffbe8);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_238,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          if (local_3e8 != 0) {
            DVar2 = *(DataType *)
                     ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes +
                     local_3e8);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      (&local_410,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x55,DVar2,TYPE_LAST,
                       in_stack_fffffffffffffbe8);
            local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_258,local_410._M_dataplus._M_p,
                       local_410._M_dataplus._M_p + local_410._M_string_length);
            verifyShader(ctx,shaderType,&local_258);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_410._M_dataplus._M_p != &local_410.field_2) {
              operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1
                             );
            }
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      (&local_410,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x56,DVar2,TYPE_LAST,
                       in_stack_fffffffffffffbe8);
            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_278,local_410._M_dataplus._M_p,
                       local_410._M_dataplus._M_p + local_410._M_string_length);
            verifyShader(ctx,shaderType,&local_278);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_410._M_dataplus._M_p != &local_410.field_2) {
              operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1
                             );
            }
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      (&local_410,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x57,DVar2,TYPE_LAST,
                       in_stack_fffffffffffffbe8);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,local_410._M_dataplus._M_p,
                       local_410._M_dataplus._M_p + local_410._M_string_length);
            verifyShader(ctx,shaderType,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_410._M_dataplus._M_p != &local_410.field_2) {
              operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1
                             );
            }
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x55,DVar1,TYPE_LAST,
                     in_stack_fffffffffffffbe8);
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_298,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x56,DVar1,TYPE_LAST,
                     in_stack_fffffffffffffbe8);
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b8,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x57,DVar1,TYPE_LAST,
                     in_stack_fffffffffffffbe8);
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d8,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x58,local_3ec,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f8,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_2f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x59,local_3ec,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_318,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_318);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x5a,local_3ec,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_338,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_338);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != &local_338.field_2) {
            operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          if (local_3e8 != 8) {
            DVar2 = *(DataType *)
                     ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes +
                     local_3e8);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      (&local_410,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x58,DVar2,TYPE_INT,
                       in_stack_fffffffffffffbe8);
            local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_358,local_410._M_dataplus._M_p,
                       local_410._M_dataplus._M_p + local_410._M_string_length);
            verifyShader(ctx,shaderType,&local_358);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_410._M_dataplus._M_p != &local_410.field_2) {
              operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1
                             );
            }
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      (&local_410,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x59,DVar2,TYPE_INT,
                       in_stack_fffffffffffffbe8);
            local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_378,local_410._M_dataplus._M_p,
                       local_410._M_dataplus._M_p + local_410._M_string_length);
            verifyShader(ctx,shaderType,&local_378);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_410._M_dataplus._M_p != &local_410.field_2) {
              operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1
                             );
            }
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      (&local_410,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x5a,DVar2,TYPE_INT,
                       in_stack_fffffffffffffbe8);
            local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_398,local_410._M_dataplus._M_p,
                       local_410._M_dataplus._M_p + local_410._M_string_length);
            verifyShader(ctx,shaderType,&local_398);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_dataplus._M_p != &local_398.field_2) {
              operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_410._M_dataplus._M_p != &local_410.field_2) {
              operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1
                             );
            }
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x58,DVar1,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3b8,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_3b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
            operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x59,DVar1,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3d8,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_3d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_410,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x5a,DVar1,TYPE_INT,
                     in_stack_fffffffffffffbe8);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_410._M_dataplus._M_p,
                     local_410._M_dataplus._M_p + local_410._M_string_length);
          verifyShader(ctx,shaderType,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
          }
          lVar7 = local_3e8 + 4;
        } while (lVar7 != 0x10);
        NegativeTestContext::endSection(ctx);
        lVar7 = local_d8;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 6);
    NegativeTestContext::endSection(ctx);
  }
  return;
}

Assistant:

void texel_fetch_invalid_p (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
	{
		ctx.beginSection("texelFetch: Invalid P type.");
		for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
		{
			if (ctx.isShaderSupported(s_shaders[shaderNdx]))
			{
				ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
				for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
				{
					// SAMPLER_2D_MULTISAMPLE
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					if (s_intTypes[dataTypeNdx] != glu::TYPE_INT_VEC2)
					{
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					// SAMPLER_BUFFER
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_BUFFER, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_BUFFER, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_BUFFER, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					if (s_intTypes[dataTypeNdx] != glu::TYPE_INT)
					{
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_BUFFER, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_BUFFER, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_BUFFER, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}

					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_BUFFER, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_BUFFER, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_BUFFER, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					// SAMPLER_2D_MULTISAMPLE_ARRAY
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					if (s_intTypes[dataTypeNdx] != glu::TYPE_INT_VEC3)
					{
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				ctx.endSection();
			}
		}
		ctx.endSection();
	}
}